

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O0

string * __thiscall z80::to_string_abi_cxx11_(string *__return_storage_ptr__,z80 *this,OpCode o)

{
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  OpCode o_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_14) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"halt",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ret",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"xor",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ld",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"jp",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"call",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ex",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"dec",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"inc",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"add",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sub",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"cp",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"push",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pop",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(const OpCode o) {
		switch (o) {
			case OpCode::_xor:
				return "xor";
			case OpCode::ld:
				return "ld";
			case OpCode::call:
				return "call";
			case OpCode::ret:
				return "ret";
			case OpCode::ex:
				return "ex";
			case OpCode::jp:
				return "jp";
			case OpCode::halt:
				return "halt";
			case OpCode::dec:
				return "dec";
			case OpCode::inc:
				return "inc";
			case OpCode::cp:
				return "cp";
			case OpCode::add:
				return "add";
			case OpCode::sub:
				return "sub";
			case OpCode::push:
				return "push";
			case OpCode::pop:
				return "pop";
			default:
				return "unknown";
		}
		return "unknown";
	}